

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS
ref_interp_scalar(REF_INTERP ref_interp,REF_INT leading_dim,REF_DBL *from_scalar,REF_DBL *to_scalar)

{
  int iVar1;
  REF_MPI pRVar2;
  REF_NODE ref_node;
  REF_INT RVar3;
  uint uVar4;
  void *pvVar5;
  REF_INT *proc;
  ulong uVar6;
  long lVar7;
  REF_DBL *pRVar8;
  undefined8 uVar9;
  uint uVar10;
  size_t __size;
  long lVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  double dVar15;
  uint local_120;
  REF_INT n_donor;
  REF_DBL *local_118;
  REF_INT *recept_node;
  REF_MPI local_108;
  void *local_100;
  void *local_f8;
  void *local_f0;
  REF_INT *donor_ret;
  REF_CELL local_e0;
  REF_INT *donor_cell;
  REF_INT *donor_node;
  REF_DBL *donor_bary;
  REF_DBL *recept_scalar;
  REF_INT *local_b8;
  REF_DBL *local_b0;
  REF_INT nodes [27];
  
  pRVar2 = ref_interp->to_grid->mpi;
  ref_node = ref_interp->to_grid->node;
  iVar1 = ref_node->max;
  uVar13 = (ulong)iVar1;
  if ((long)uVar13 < 1) {
    uVar10 = 0;
  }
  else {
    uVar6 = 0;
    uVar10 = 0;
    do {
      if ((-1 < ref_node->global[uVar6]) && (ref_node->ref_mpi->id == ref_node->part[uVar6])) {
        uVar10 = uVar10 + 1;
        local_120 = uVar10;
      }
      uVar6 = uVar6 + 1;
    } while (uVar13 != uVar6);
    if ((int)uVar10 < 0) {
      pcVar12 = "malloc recept_bary of REF_DBL negative";
      uVar9 = 0x81e;
      goto LAB_00167a54;
    }
  }
  local_e0 = (&ref_interp->from_tet)[ref_interp->from_grid->twod != 0];
  local_b0 = from_scalar;
  pvVar5 = malloc((ulong)(uVar10 * 4) << 3);
  if (pvVar5 == (void *)0x0) {
    pcVar12 = "malloc recept_bary of REF_DBL NULL";
    uVar9 = 0x81e;
  }
  else {
    __size = (ulong)uVar10 << 2;
    local_f0 = pvVar5;
    pvVar5 = malloc(__size);
    if (pvVar5 == (void *)0x0) {
      pcVar12 = "malloc recept_cell of REF_INT NULL";
      uVar9 = 0x81f;
    }
    else {
      local_f8 = pvVar5;
      recept_node = (REF_INT *)malloc(__size);
      local_b8 = recept_node;
      if (recept_node == (REF_INT *)0x0) {
        pcVar12 = "malloc recept_node of REF_INT NULL";
        uVar9 = 0x820;
      }
      else {
        pvVar5 = malloc(__size);
        if (pvVar5 == (void *)0x0) {
          pcVar12 = "malloc recept_ret of REF_INT NULL";
          uVar9 = 0x821;
        }
        else {
          local_100 = pvVar5;
          proc = (REF_INT *)malloc(__size);
          if (proc != (REF_INT *)0x0) {
            local_120 = 0;
            local_118 = to_scalar;
            local_108 = pRVar2;
            if (iVar1 < 1) {
              uVar10 = 0;
            }
            else {
              lVar14 = 0;
              uVar10 = 0;
              lVar11 = 0;
              do {
                if ((-1 < ref_node->global[lVar11]) &&
                   (ref_node->ref_mpi->id == ref_node->part[lVar11])) {
                  if (ref_interp->cell[lVar11] == -1) {
                    pcVar12 = "node needs to be localized";
                    uVar9 = 0x827;
                    goto LAB_00167a54;
                  }
                  uVar4 = ref_node_clip_bary4((REF_DBL *)((long)ref_interp->bary + lVar14),
                                              (REF_DBL *)
                                              ((long)local_f0 + (long)(int)(uVar10 * 4) * 8));
                  if (uVar4 != 0) {
                    uVar13 = (ulong)uVar4;
                    pcVar12 = "clip";
                    uVar9 = 0x82a;
                    goto LAB_00167e3c;
                  }
                  lVar7 = (long)(int)uVar10;
                  proc[lVar7] = ref_interp->part[lVar11];
                  *(REF_INT *)((long)local_f8 + lVar7 * 4) = ref_interp->cell[lVar11];
                  local_b8[lVar7] = (REF_INT)lVar11;
                  *(REF_INT *)((long)local_100 + lVar7 * 4) = local_108->id;
                  uVar10 = uVar10 + 1;
                  uVar13 = (ulong)(uint)ref_node->max;
                  local_120 = uVar10;
                }
                lVar11 = lVar11 + 1;
                lVar14 = lVar14 + 0x20;
              } while (lVar11 < (int)uVar13);
            }
            pRVar2 = local_108;
            uVar10 = ref_mpi_blindsend(local_108,proc,local_f8,1,uVar10,&donor_cell,&n_donor,1);
            if (uVar10 == 0) {
              uVar10 = ref_mpi_blindsend(pRVar2,proc,local_100,1,local_120,&donor_ret,&n_donor,1);
              if (uVar10 == 0) {
                uVar10 = ref_mpi_blindsend(pRVar2,proc,recept_node,1,local_120,&donor_node,&n_donor,
                                           1);
                if (uVar10 == 0) {
                  uVar10 = ref_mpi_blindsend(pRVar2,proc,local_f0,4,local_120,&donor_bary,&n_donor,3
                                            );
                  if (uVar10 == 0) {
                    free(proc);
                    free(local_100);
                    if (recept_node != (REF_INT *)0x0) {
                      free(recept_node);
                    }
                    free(local_f8);
                    free(local_f0);
                    RVar3 = n_donor;
                    if (n_donor * leading_dim < 0) {
                      pcVar12 = "malloc donor_scalar of REF_DBL negative";
                      uVar9 = 0x846;
LAB_00167a54:
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,uVar9,"ref_interp_scalar",pcVar12);
                      return 1;
                    }
                    pvVar5 = malloc((ulong)(uint)(n_donor * leading_dim) << 3);
                    if (pvVar5 == (void *)0x0) {
                      pcVar12 = "malloc donor_scalar of REF_DBL NULL";
                      uVar9 = 0x846;
                      goto LAB_00167c7b;
                    }
                    if (0 < RVar3) {
                      lVar11 = 0;
                      do {
                        uVar10 = ref_cell_nodes(local_e0,donor_cell[lVar11],nodes);
                        if (uVar10 != 0) {
                          uVar13 = (ulong)uVar10;
                          pcVar12 = "node needs to be localized";
                          uVar9 = 0x84a;
                          goto LAB_00167e3c;
                        }
                        if (0 < leading_dim) {
                          lVar14 = lVar11 * (ulong)(uint)leading_dim;
                          uVar10 = local_e0->node_per;
                          uVar13 = 0;
                          do {
                            *(undefined8 *)((long)pvVar5 + uVar13 * 8 + lVar14 * 8) = 0;
                            if (0 < (int)uVar10) {
                              dVar15 = 0.0;
                              uVar6 = 0;
                              do {
                                dVar15 = dVar15 + donor_bary
                                                  [(ulong)((uint)lVar11 & 0x3fffffff) * 4 + uVar6] *
                                                  local_b0[nodes[uVar6] * leading_dim + (int)uVar13]
                                ;
                                *(double *)((long)pvVar5 + uVar13 * 8 + lVar14 * 8) = dVar15;
                                uVar6 = uVar6 + 1;
                              } while (uVar10 != uVar6);
                            }
                            uVar13 = uVar13 + 1;
                          } while (uVar13 != (uint)leading_dim);
                        }
                        lVar11 = lVar11 + 1;
                      } while (lVar11 < n_donor);
                    }
                    if (donor_cell != (REF_INT *)0x0) {
                      free(donor_cell);
                    }
                    pRVar2 = local_108;
                    if (donor_bary != (REF_DBL *)0x0) {
                      free(donor_bary);
                    }
                    uVar10 = ref_mpi_blindsend(pRVar2,donor_ret,pvVar5,leading_dim,n_donor,
                                               &recept_scalar,(REF_INT *)&local_120,3);
                    if (uVar10 == 0) {
                      uVar10 = ref_mpi_blindsend(pRVar2,donor_ret,donor_node,1,n_donor,&recept_node,
                                                 (REF_INT *)&local_120,1);
                      if (uVar10 == 0) {
                        free(pvVar5);
                        if (donor_node != (REF_INT *)0x0) {
                          free(donor_node);
                        }
                        if (donor_ret != (REF_INT *)0x0) {
                          free(donor_ret);
                        }
                        if (0 < (long)(int)local_120) {
                          lVar11 = 0;
                          pRVar8 = recept_scalar;
                          do {
                            if (0 < leading_dim) {
                              iVar1 = recept_node[lVar11];
                              uVar13 = 0;
                              do {
                                if (0x7fefffffffffffff < (ulong)ABS(pRVar8[uVar13])) {
                                  pcVar12 = "recept_scalar";
                                  uVar9 = 0x872;
                                  goto LAB_00167a54;
                                }
                                local_118[(long)(iVar1 * leading_dim) + uVar13] = pRVar8[uVar13];
                                uVar13 = uVar13 + 1;
                              } while ((uint)leading_dim != uVar13);
                            }
                            lVar11 = lVar11 + 1;
                            pRVar8 = pRVar8 + leading_dim;
                          } while (lVar11 != (int)local_120);
                        }
                        if (recept_node != (REF_INT *)0x0) {
                          free(recept_node);
                        }
                        if (recept_scalar != (REF_DBL *)0x0) {
                          free(recept_scalar);
                        }
                        uVar10 = ref_node_ghost_dbl(ref_node,local_118,leading_dim);
                        if (uVar10 == 0) {
                          if ((long)ref_node->max < 1) {
                            return 0;
                          }
                          lVar11 = 0;
                          do {
                            if (-1 < ref_node->global[lVar11] && 0 < leading_dim) {
                              uVar13 = 0;
                              do {
                                if (0x7fefffffffffffff < (ulong)ABS(local_118[uVar13])) {
                                  pcVar12 = "to_scalar ghost";
                                  uVar9 = 0x885;
                                  goto LAB_00167a54;
                                }
                                uVar13 = uVar13 + 1;
                              } while ((uint)leading_dim != uVar13);
                            }
                            lVar11 = lVar11 + 1;
                            local_118 = local_118 + (uint)leading_dim;
                            if (lVar11 == ref_node->max) {
                              return 0;
                            }
                          } while( true );
                        }
                        pcVar12 = "ghost";
                        uVar9 = 0x882;
                        uVar13 = (ulong)uVar10;
                      }
                      else {
                        uVar13 = (ulong)uVar10;
                        pcVar12 = "blind send node";
                        uVar9 = 0x869;
                      }
                    }
                    else {
                      uVar13 = (ulong)uVar10;
                      pcVar12 = "blind send bary";
                      uVar9 = 0x866;
                    }
                  }
                  else {
                    uVar13 = (ulong)uVar10;
                    pcVar12 = "blind send bary";
                    uVar9 = 0x83e;
                  }
                }
                else {
                  uVar13 = (ulong)uVar10;
                  pcVar12 = "blind send node";
                  uVar9 = 0x83b;
                }
              }
              else {
                uVar13 = (ulong)uVar10;
                pcVar12 = "blind send ret";
                uVar9 = 0x838;
              }
            }
            else {
              uVar13 = (ulong)uVar10;
              pcVar12 = "blind send cell";
              uVar9 = 0x835;
            }
LAB_00167e3c:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,uVar9,"ref_interp_scalar",uVar13,pcVar12);
            return (REF_STATUS)uVar13;
          }
          pcVar12 = "malloc recept_proc of REF_INT NULL";
          uVar9 = 0x822;
        }
      }
    }
  }
LAB_00167c7b:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar9,
         "ref_interp_scalar",pcVar12);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_interp_scalar(REF_INTERP ref_interp, REF_INT leading_dim,
                                     REF_DBL *from_scalar, REF_DBL *to_scalar) {
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_MPI ref_mpi = ref_grid_mpi(to_grid);
  REF_CELL from_cell;
  REF_INT node, ibary, im;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT receptor, n_recept, donation, n_donor;
  REF_DBL *recept_scalar, *donor_scalar, *recept_bary, *donor_bary;
  REF_INT *donor_node, *donor_ret, *donor_cell;
  REF_INT *recept_proc, *recept_ret, *recept_node, *recept_cell;

  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node)) {
      n_recept++;
    }
  }

  ref_malloc(recept_bary, 4 * n_recept, REF_DBL);
  ref_malloc(recept_cell, n_recept, REF_INT);
  ref_malloc(recept_node, n_recept, REF_INT);
  ref_malloc(recept_ret, n_recept, REF_INT);
  ref_malloc(recept_proc, n_recept, REF_INT);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node)) {
      RUS(REF_EMPTY, ref_interp->cell[node], "node needs to be localized");
      RSS(ref_node_clip_bary4(&(ref_interp->bary[4 * node]),
                              &(recept_bary[4 * n_recept])),
          "clip");
      recept_proc[n_recept] = ref_interp->part[node];
      recept_cell[n_recept] = ref_interp->cell[node];
      recept_node[n_recept] = node;
      recept_ret[n_recept] = ref_mpi_rank(ref_mpi);
      n_recept++;
    }
  }

  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_cell, 1, n_recept,
                        (void **)(&donor_cell), &n_donor, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_ret, 1, n_recept,
                        (void **)(&donor_ret), &n_donor, REF_INT_TYPE),
      "blind send ret");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_node, 1, n_recept,
                        (void **)(&donor_node), &n_donor, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_bary, 4, n_recept,
                        (void **)(&donor_bary), &n_donor, REF_DBL_TYPE),
      "blind send bary");

  ref_free(recept_proc);
  ref_free(recept_ret);
  ref_free(recept_node);
  ref_free(recept_cell);
  ref_free(recept_bary);

  ref_malloc(donor_scalar, leading_dim * n_donor, REF_DBL);

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (im = 0; im < leading_dim; im++) {
      donor_scalar[im + leading_dim * donation] = 0.0;
      for (ibary = 0; ibary < ref_cell_node_per(from_cell); ibary++) {
        donor_scalar[im + leading_dim * donation] +=
            donor_bary[ibary + 4 * donation] *
            from_scalar[im + leading_dim * nodes[ibary]];
      }
      /*
      RAB(isfinite(donor_scalar[im + leading_dim * donation]), "donor_scalar", {
        printf("%.20e\n", donor_scalar[im + leading_dim * donation]);
        for (ibary = 0; ibary < ref_cell_node_per(from_cell); ibary++) {
          printf("%.20e %.20e %.20e\n",
                 donor_bary[ibary + 4 * donation] *
                     from_scalar[im + leading_dim * nodes[ibary]],
                 donor_bary[ibary + 4 * donation],
                 from_scalar[im + leading_dim * nodes[ibary]]);
        }
      });
      */
    }
  }
  ref_free(donor_cell);
  ref_free(donor_bary);

  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_scalar, leading_dim,
                        n_donor, (void **)(&recept_scalar), &n_recept,
                        REF_DBL_TYPE),
      "blind send bary");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_node, 1, n_donor,
                        (void **)(&recept_node), &n_recept, REF_INT_TYPE),
      "blind send node");
  ref_free(donor_scalar);
  ref_free(donor_node);
  ref_free(donor_ret);

  for (receptor = 0; receptor < n_recept; receptor++) {
    node = recept_node[receptor];
    for (im = 0; im < leading_dim; im++) {
      RAS(isfinite(recept_scalar[im + leading_dim * receptor]),
          "recept_scalar");
      to_scalar[im + leading_dim * node] =
          recept_scalar[im + leading_dim * receptor];
    }
  }

  ref_free(recept_node);
  ref_free(recept_scalar);

  /*
  each_ref_node_valid_node(to_node, node) {
    for (im = 0; im < leading_dim; im++) {
      RAS(isfinite(to_scalar[im + leading_dim * node]), "to_scalar local");
    }
  }
  */
  RSS(ref_node_ghost_dbl(to_node, to_scalar, leading_dim), "ghost");
  each_ref_node_valid_node(to_node, node) {
    for (im = 0; im < leading_dim; im++) {
      RAS(isfinite(to_scalar[im + leading_dim * node]), "to_scalar ghost");
    }
  }

  return REF_SUCCESS;
}